

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_prng.cpp
# Opt level: O1

void __thiscall Kumu::FortunaRNG::FortunaRNG(FortunaRNG *this)

{
  Mutex *__mutex;
  h__RNG *this_00;
  ILogSink *this_01;
  ui32_t read_count;
  FileReader URandom;
  Result_t result;
  byte_t rng_key [512];
  ui32_t local_32c;
  FileReader local_328;
  undefined1 local_2f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [5];
  Result_t local_290;
  byte_t local_228 [520];
  
  if (s_RNG == (h__RNG *)0x0) {
    this_00 = (h__RNG *)operator_new(0xe8);
    __mutex = &this_00->m_Lock;
    pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
    this_00->m_ctr_buf[0] = '\0';
    this_00->m_ctr_buf[1] = '\0';
    this_00->m_ctr_buf[2] = '\0';
    this_00->m_ctr_buf[3] = '\0';
    this_00->m_ctr_buf[4] = '\0';
    this_00->m_ctr_buf[5] = '\0';
    this_00->m_ctr_buf[6] = '\0';
    this_00->m_ctr_buf[7] = '\0';
    this_00->m_ctr_buf[8] = '\0';
    this_00->m_ctr_buf[9] = '\0';
    this_00->m_ctr_buf[10] = '\0';
    this_00->m_ctr_buf[0xb] = '\0';
    this_00->m_ctr_buf[0xc] = '\0';
    this_00->m_ctr_buf[0xd] = '\0';
    this_00->m_ctr_buf[0xe] = '\0';
    this_00->m_ctr_buf[0xf] = '\0';
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    FileReader::FileReader(&local_328);
    local_2f8._16_8_ = 0x6172752f7665642f;
    local_2e0[0]._0_4_ = 0x6d6f646e;
    local_2f8._8_8_ = (pointer)0xc;
    local_2e0[0]._M_local_buf[4] = '\0';
    local_2f8._0_8_ = local_2f8 + 0x10;
    FileReader::OpenRead(&local_290,&local_328,(string *)local_2f8);
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    if (-1 < local_290.value) {
      FileReader::Read((Result_t *)local_2f8,&local_328,local_228,0x200,&local_32c);
      Result_t::operator=(&local_290,(Result_t *)local_2f8);
      Result_t::~Result_t((Result_t *)local_2f8);
    }
    if (local_290.value < 0) {
      this_01 = DefaultLogSink();
      ILogSink::Error(this_01,"Error opening random device: %s\n","/dev/urandom");
    }
    Result_t::~Result_t(&local_290);
    FileReader::~FileReader(&local_328);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    anon_unknown.dwarf_3c9e8::h__RNG::set_key(this_00,local_228);
    s_RNG = this_00;
  }
  return;
}

Assistant:

Kumu::FortunaRNG::FortunaRNG()
{
  if ( s_RNG == 0 )
    s_RNG = new h__RNG;
}